

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O1

bool __thiscall
iDynTree::InverseKinematics::setDesiredFullJointsConfiguration
          (InverseKinematics *this,Span<const_double,__1L> desiredJointConfiguration,double weight)

{
  iDynTree::reportError
            ("InverseKinematics","",
             "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
  return false;
}

Assistant:

bool InverseKinematics::setDesiredFullJointsConfiguration(iDynTree::Span<const double> desiredJointConfiguration,
                                                              double weight)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        assert(IK_PIMPL(m_pimpl)->m_preferredJointsConfiguration.size() == desiredJointConfiguration.size());
        IK_PIMPL(m_pimpl)->m_preferredJointsConfiguration = desiredJointConfiguration;
        if (weight >= 0.0) {
            iDynTree::toEigen(IK_PIMPL(m_pimpl)->m_preferredJointsWeight).setConstant(weight);
        }
        return true;
#else
        return missingIpoptErrorReport();
#endif
    }